

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_disk_set_standard_lookup.c
# Opt level: O1

int64_t lookup_uid(void *private_data,char *uname,int64_t uid)

{
  undefined8 *puVar1;
  int iVar2;
  char *pcVar3;
  char cVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  char *__ptr;
  size_t bufsize;
  size_t __buflen;
  passwd *result;
  passwd pwent;
  char _buffer [128];
  passwd *local_f8;
  ulong local_f0;
  passwd local_e8;
  char local_b8 [136];
  
  if ((uname != (char *)0x0) && (cVar4 = *uname, cVar4 != '\0')) {
    pcVar3 = uname + 1;
    uVar7 = 0;
    do {
      uVar6 = uVar7 * 0x10 + (int)cVar4;
      uVar7 = uVar6 & 0xfffffff ^ (uVar6 & 0xf0000000) >> 0x18;
      if ((uVar6 & 0xf0000000) == 0) {
        uVar7 = uVar6;
      }
      cVar4 = *pcVar3;
      pcVar3 = pcVar3 + 1;
    } while (cVar4 != '\0');
    uVar5 = (ulong)(((int)((ulong)(long)(int)uVar7 / 0x7f) * -0x7f + uVar7) * 0x10);
    puVar1 = (undefined8 *)((long)private_data + uVar5);
    pcVar3 = *(char **)((long)private_data + uVar5);
    if (pcVar3 != (char *)0x0) {
      if ((*(uint *)(puVar1 + 1) == uVar7) && (iVar2 = strcmp(uname,pcVar3), iVar2 == 0)) {
        return (ulong)*(uint *)((long)puVar1 + 0xc);
      }
      if (pcVar3 != (char *)0x0) {
        free(pcVar3);
      }
    }
    local_f0 = uid;
    pcVar3 = strdup(uname);
    *puVar1 = pcVar3;
    *(uint *)(puVar1 + 1) = uVar7;
    pcVar3 = local_b8;
    __buflen = 0x80;
    __ptr = (char *)0x0;
    do {
      local_f8 = &local_e8;
      iVar2 = getpwnam_r(uname,&local_e8,pcVar3,__buflen,&local_f8);
      if (iVar2 != 0x22) goto LAB_00141e14;
      __buflen = __buflen * 2;
      free(__ptr);
      pcVar3 = (char *)malloc(__buflen);
      __ptr = pcVar3;
    } while (pcVar3 != (char *)0x0);
    __ptr = (char *)0x0;
LAB_00141e14:
    uid = local_f0;
    if (local_f8 != (passwd *)0x0) {
      uid = (int64_t)local_f8->pw_uid;
    }
    free(__ptr);
    *(int *)((long)puVar1 + 0xc) = (int)uid;
  }
  return uid;
}

Assistant:

static int64_t
lookup_uid(void *private_data, const char *uname, int64_t uid)
{
	int h;
	struct bucket *b;
	struct bucket *ucache = (struct bucket *)private_data;

	/* If no uname, just use the uid provided. */
	if (uname == NULL || *uname == '\0')
		return (uid);

	/* Try to find uname in the cache. */
	h = hash(uname);
	b = &ucache[h % cache_size ];
	if (b->name != NULL && b->hash == h && strcmp(uname, b->name) == 0)
		return ((uid_t)b->id);

	/* Free the cache slot for a new entry. */
	if (b->name != NULL)
		free(b->name);
	b->name = strdup(uname);
	/* Note: If strdup fails, that's okay; we just won't cache. */
	b->hash = h;
#if HAVE_PWD_H
#  if HAVE_GETPWNAM_R
	{
		char _buffer[128];
		size_t bufsize = 128;
		char *buffer = _buffer;
		char *allocated = NULL;
		struct passwd	pwent, *result;
		int r;

		for (;;) {
			result = &pwent; /* Old getpwnam_r ignores last arg. */
			r = getpwnam_r(uname, &pwent, buffer, bufsize, &result);
			if (r == 0)
				break;
			if (r != ERANGE)
				break;
			bufsize *= 2;
			free(allocated);
			allocated = malloc(bufsize);
			if (allocated == NULL)
				break;
			buffer = allocated;
		}
		if (result != NULL)
			uid = result->pw_uid;
		free(allocated);
	}
#  else /* HAVE_GETPWNAM_R */
	{
		struct passwd *result;

		result = getpwnam(uname);
		if (result != NULL)
			uid = result->pw_uid;
	}
#endif	/* HAVE_GETPWNAM_R */
#elif defined(_WIN32) && !defined(__CYGWIN__)
	/* TODO: do a uname->uid lookup for Windows. */
#else
	#error No way to look up uids on this platform
#endif
	b->id = (uid_t)uid;

	return (uid);
}